

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O2

int main(void)

{
  system("rm -rf  filemgr_testfile");
  basic_test(0);
  basic_test(-1);
  mt_init_test();
  return 0;
}

Assistant:

int main()
{
    int r = system(SHELL_DEL" filemgr_testfile");
    (void)r;

    basic_test(FDB_ENCRYPTION_NONE);
    basic_test(FDB_ENCRYPTION_BOGUS);
    mt_init_test();

    return 0;
}